

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmpset.cpp
# Opt level: O2

void icu_63::set32x64Bits(uint32_t *table,int32_t start,int32_t limit)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  int iVar4;
  uint uVar5;
  
  iVar4 = start >> 6;
  uVar5 = 1 << ((byte)iVar4 & 0x1f);
  uVar2 = (ulong)(start & 0x3fU);
  if (start + 1 == limit) {
    table[uVar2] = table[uVar2] | uVar5;
  }
  else {
    iVar1 = limit >> 6;
    if (iVar4 == iVar1) {
      for (; uVar2 < (limit & 0x3fU); uVar2 = uVar2 + 1) {
        table[uVar2] = table[uVar2] | uVar5;
      }
    }
    else {
      if ((start & 0x3fU) != 0) {
        do {
          table[uVar2] = table[uVar2] | uVar5;
          uVar2 = uVar2 + 1;
        } while (uVar2 != 0x40);
        iVar4 = iVar4 + 1;
      }
      if (iVar4 < iVar1) {
        uVar5 = ~(-1 << ((byte)iVar1 & 0x1f));
        if (0x1f < iVar1) {
          uVar5 = 0xffffffff;
        }
        for (lVar3 = 0; lVar3 != 0x40; lVar3 = lVar3 + 1) {
          table[lVar3] = table[lVar3] | (uVar5 >> ((byte)iVar4 & 0x1f)) << ((byte)iVar4 & 0x1f);
        }
      }
      uVar5 = 0x80000000;
      if (iVar1 != 0x20) {
        uVar5 = 1 << ((byte)iVar1 & 0x1f);
      }
      for (uVar2 = 0; (limit & 0x3fU) != uVar2; uVar2 = uVar2 + 1) {
        table[uVar2] = table[uVar2] | uVar5;
      }
    }
  }
  return;
}

Assistant:

static void set32x64Bits(uint32_t table[64], int32_t start, int32_t limit) {
    U_ASSERT(start<limit);
    U_ASSERT(limit<=0x800);

    int32_t lead=start>>6;  // Named for UTF-8 2-byte lead byte with upper 5 bits.
    int32_t trail=start&0x3f;  // Named for UTF-8 2-byte trail byte with lower 6 bits.

    // Set one bit indicating an all-one block.
    uint32_t bits=(uint32_t)1<<lead;
    if((start+1)==limit) {  // Single-character shortcut.
        table[trail]|=bits;
        return;
    }

    int32_t limitLead=limit>>6;
    int32_t limitTrail=limit&0x3f;

    if(lead==limitLead) {
        // Partial vertical bit column.
        while(trail<limitTrail) {
            table[trail++]|=bits;
        }
    } else {
        // Partial vertical bit column,
        // followed by a bit rectangle,
        // followed by another partial vertical bit column.
        if(trail>0) {
            do {
                table[trail++]|=bits;
            } while(trail<64);
            ++lead;
        }
        if(lead<limitLead) {
            bits=~(((unsigned)1<<lead)-1);
            if(limitLead<0x20) {
                bits&=((unsigned)1<<limitLead)-1;
            }
            for(trail=0; trail<64; ++trail) {
                table[trail]|=bits;
            }
        }
        // limit<=0x800. If limit==0x800 then limitLead=32 and limitTrail=0.
        // In that case, bits=1<<limitLead is undefined but the bits value
        // is not used because trail<limitTrail is already false.
        bits=(uint32_t)1<<((limitLead == 0x20) ? (limitLead - 1) : limitLead);
        for(trail=0; trail<limitTrail; ++trail) {
            table[trail]|=bits;
        }
    }
}